

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O0

int __thiscall UdpBitDht::tick(UdpBitDht *this)

{
  int iVar1;
  bool bVar2;
  uint local_43c;
  undefined1 local_438 [4];
  int size;
  sockaddr_in toAddr;
  char data [1024];
  int i;
  bdStackMutex stack;
  UdpBitDht *this_local;
  
  stack.mMtx = (bdMutex *)this;
  bdStackMutex::bdStackMutex((bdStackMutex *)&stack0xffffffffffffffe0,&this->dhtMtx);
  data[0x3fc] = '\0';
  data[0x3fd] = '\0';
  data[0x3fe] = '\0';
  data[0x3ff] = '\0';
  while( true ) {
    local_43c = 0x400;
    bVar2 = false;
    if ((int)data._1020_4_ < 100) {
      iVar1 = bdNode::outgoingMsg(&this->mBitDhtManager->super_bdNode,(sockaddr_in *)local_438,
                                  (char *)toAddr.sin_zero,(int *)&local_43c);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    this->mWriteBytes = this->mWriteBytes + local_43c;
    (*(this->super_UdpSubReceiver).super_UdpReceiver._vptr_UdpReceiver[4])
              (this,toAddr.sin_zero,(ulong)local_43c,local_438,0x40);
    data._1020_4_ = data._1020_4_ + 1;
  }
  this_local._4_4_ = (uint)(data._1020_4_ == 100);
  bdStackMutex::~bdStackMutex((bdStackMutex *)&stack0xffffffffffffffe0);
  return this_local._4_4_;
}

Assistant:

int UdpBitDht::tick() {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	/* pass on messages from the node */
	int i = 0;
	char data[BITDHT_MAX_PKTSIZE];
	struct sockaddr_in toAddr;
	int size = BITDHT_MAX_PKTSIZE;

	while((i < MAX_MSG_PER_TICK) && (mBitDhtManager->outgoingMsg(&toAddr, data, &size))) {
#ifdef DEBUG_UDP_BITDHT 
		std::cerr << "UdpBitDht::tick() outgoing msg(" << size << ") to " << toAddr;
		std::cerr << std::endl;
#endif

		mWriteBytes += size;
		sendPkt(data, size, toAddr, BITDHT_TTL);

		// iterate
		i++;
		size = BITDHT_MAX_PKTSIZE; // reset msg size!
	}

	if (i == MAX_MSG_PER_TICK)
		return 1; /* keep on ticking */
	return 0;
}